

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PragmaName * pragmaLocate(char *zName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  PragmaName *pPVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = 0;
  uVar8 = 0;
  iVar6 = 0x39;
  while (iVar7 <= iVar6) {
    uVar8 = (long)(iVar6 + iVar7) / 2;
    iVar2 = (int)uVar8;
    uVar8 = uVar8 & 0xffffffff;
    lVar5 = (long)iVar2;
    iVar3 = sqlite3_stricmp(zName,aPragmaName[lVar5].zName);
    if (iVar3 == 0) goto LAB_0023cf1f;
    iVar1 = iVar2 + 1;
    if (iVar3 < 0) {
      iVar1 = iVar7;
    }
    iVar7 = iVar1;
    if (iVar3 < 0) {
      iVar6 = iVar2 + -1;
    }
  }
  lVar5 = (long)(int)uVar8;
LAB_0023cf1f:
  pPVar4 = (PragmaName *)0x0;
  if (iVar7 <= iVar6) {
    pPVar4 = aPragmaName + lVar5;
  }
  return pPVar4;
}

Assistant:

static const PragmaName *pragmaLocate(const char *zName){
  int upr, lwr, mid = 0, rc;
  lwr = 0;
  upr = ArraySize(aPragmaName)-1;
  while( lwr<=upr ){
    mid = (lwr+upr)/2;
    rc = sqlite3_stricmp(zName, aPragmaName[mid].zName);
    if( rc==0 ) break;
    if( rc<0 ){
      upr = mid - 1;
    }else{
      lwr = mid + 1;
    }
  }
  return lwr>upr ? 0 : &aPragmaName[mid];
}